

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluator.h
# Opt level: O0

string * __thiscall
TextContent::Evaluate_abi_cxx11_
          (string *__return_storage_ptr__,TextContent *this,cmGeneratorExpressionContext *param_1,
          cmGeneratorExpressionDAGChecker *param_2)

{
  char *pcVar1;
  ulong uVar2;
  allocator local_29;
  cmGeneratorExpressionDAGChecker *local_28;
  cmGeneratorExpressionDAGChecker *param_2_local;
  cmGeneratorExpressionContext *param_1_local;
  TextContent *this_local;
  
  pcVar1 = this->Content;
  uVar2 = this->Length;
  local_28 = param_2;
  param_2_local = (cmGeneratorExpressionDAGChecker *)param_1;
  param_1_local = (cmGeneratorExpressionContext *)this;
  this_local = (TextContent *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,uVar2,&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(cmGeneratorExpressionContext *,
                       cmGeneratorExpressionDAGChecker *) const
  {
    return std::string(this->Content, this->Length);
  }